

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

void Au_ManFree(Au_Man_t *p)

{
  int iVar1;
  void **__ptr;
  
  iVar1 = p->nRefs;
  if (iVar1 < 1) {
    __assert_fail("p->nRefs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                  ,0x152,"void Au_ManFree(Au_Man_t *)");
  }
  p->nRefs = iVar1 + -1;
  if (iVar1 == 1) {
    if (p->pFuncs != (Abc_Nam_t *)0x0) {
      Abc_NamStop(p->pFuncs);
    }
    __ptr = (p->vNtks).pArray;
    if (__ptr != (void **)0x0) {
      free(__ptr);
      (p->vNtks).pArray = (void **)0x0;
    }
    if (p->pName != (char *)0x0) {
      free(p->pName);
    }
    free(p);
    return;
  }
  return;
}

Assistant:

void Au_ManFree( Au_Man_t * p )
{
    assert( p->nRefs > 0 );
    if ( --p->nRefs > 0 )
        return;
    if ( p->pFuncs )
        Abc_NamStop( p->pFuncs );
    ABC_FREE( p->vNtks.pArray );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}